

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_jac_m_jact(REF_DBL *jac,REF_DBL *m,REF_DBL *jac_m_jact)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  REF_DBL *pRVar5;
  REF_DBL *pRVar6;
  long lVar7;
  REF_DBL local_f8 [10];
  double local_a8 [5];
  REF_DBL full_jac_m_jact [9];
  
  full_jac_m_jact[8] = m[1];
  full_jac_m_jact[5] = *m;
  full_jac_m_jact[6] = m[1];
  full_jac_m_jact[7] = m[2];
  lVar3 = 0;
  pRVar5 = jac;
  do {
    lVar7 = 0;
    pRVar6 = full_jac_m_jact + 5;
    do {
      dVar1 = 0.0;
      lVar4 = 0;
      pdVar2 = pRVar5;
      do {
        dVar1 = dVar1 + *pdVar2 * pRVar6[lVar4];
        lVar4 = lVar4 + 1;
        pdVar2 = pdVar2 + 3;
      } while (lVar4 != 3);
      local_a8[lVar7 * 3 + lVar3] = dVar1;
      lVar7 = lVar7 + 1;
      pRVar6 = pRVar6 + 3;
    } while (lVar7 != 3);
    lVar3 = lVar3 + 1;
    pRVar5 = pRVar5 + 1;
  } while (lVar3 != 3);
  pdVar2 = local_a8;
  lVar3 = 0;
  do {
    lVar7 = 0;
    pRVar5 = jac;
    do {
      dVar1 = 0.0;
      lVar4 = 0;
      do {
        dVar1 = dVar1 + *(double *)((long)pdVar2 + lVar4) * *(double *)((long)pRVar5 + lVar4);
        lVar4 = lVar4 + 0x18;
      } while (lVar4 != 0x48);
      local_f8[lVar7 * 3 + lVar3] = dVar1;
      lVar7 = lVar7 + 1;
      pRVar5 = pRVar5 + 1;
    } while (lVar7 != 3);
    lVar3 = lVar3 + 1;
    pdVar2 = pdVar2 + 1;
  } while (lVar3 != 3);
  *jac_m_jact = local_f8[0];
  jac_m_jact[1] = local_f8[3];
  jac_m_jact[2] = local_f8[6];
  jac_m_jact[3] = local_f8[4];
  jac_m_jact[4] = local_f8[7];
  jac_m_jact[5] = local_f8[8];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_jac_m_jact(REF_DBL *jac, REF_DBL *m,
                                         REF_DBL *jac_m_jact) {
  REF_DBL full[9];
  REF_DBL jac_m[9];
  REF_DBL full_jac_m_jact[9];
  REF_INT i, j, k;

  RSS(ref_matrix_m_full(m, full), "full");

  for (i = 0; i < 3; i++) {
    for (j = 0; j < 3; j++) {
      jac_m[i + 3 * j] = 0;
      for (k = 0; k < 3; k++) {
        jac_m[i + 3 * j] += jac[i + 3 * k] * full[k + 3 * j];
      }
    }
  }

  for (i = 0; i < 3; i++) {
    for (j = 0; j < 3; j++) {
      full_jac_m_jact[i + 3 * j] = 0;
      for (k = 0; k < 3; k++) {
        full_jac_m_jact[i + 3 * j] += jac_m[i + 3 * k] * jac[j + 3 * k];
      }
    }
  }

  RSS(ref_matrix_full_m(full_jac_m_jact, jac_m_jact), "full");

  return REF_SUCCESS;
}